

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::char_spec_handler::on_int(char_spec_handler *this)

{
  ulong uVar1;
  char cVar2;
  buffer<char> *pbVar3;
  size_t sVar4;
  byte bVar5;
  int_writer<char,_fmt::v6::basic_format_specs<char>_> local_40;
  
  local_40.writer = &this->formatter->writer_;
  local_40.specs =
       ((arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *)
       local_40.writer)->specs_;
  cVar2 = this->value;
  if (local_40.specs == (format_specs *)0x0) {
    pbVar3 = (((arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *)
              local_40.writer)->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + 1;
    if (pbVar3->capacity_ < uVar1) {
      (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
    }
    pbVar3->size_ = uVar1;
    pbVar3->ptr_[sVar4] = cVar2;
  }
  else {
    local_40.abs_value = (unsigned_type)cVar2;
    local_40.prefix_size = 0;
    if (cVar2 < '\0') {
      local_40.prefix[0] = '-';
      local_40.prefix_size = 1;
      local_40.abs_value = -local_40.abs_value;
    }
    else {
      bVar5 = (byte)(local_40.specs)->field_0x9 >> 4 & 7;
      if (1 < bVar5) {
        local_40.prefix[0] = ' ';
        if (bVar5 == 2) {
          local_40.prefix[0] = '+';
        }
        local_40.prefix_size = 1;
      }
    }
    handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>>
              ((local_40.specs)->type,&local_40);
  }
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }